

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O0

int run_test_tty(void)

{
  FILE *pFVar1;
  int iVar2;
  int file;
  uv_handle_type uVar3;
  uv_loop_t *puVar4;
  int *piVar5;
  char *pcVar6;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  uv_tty_t tty_out;
  uv_tty_t tty_in;
  uv_os_fd_t ttyout_fd;
  uv_os_fd_t ttyin_fd;
  int height;
  int width;
  int r;
  
  puVar4 = uv_default_loop();
  iVar2 = open64("/dev/tty",0);
  pFVar1 = _stderr;
  if (iVar2 < 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(pFVar1,"Cannot open /dev/tty as read-only: %s\n",pcVar6);
    fflush(_stderr);
    width = 7;
  }
  else {
    file = open64("/dev/tty",1,0);
    pFVar1 = _stderr;
    if (file < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar1,"Cannot open /dev/tty as write-only: %s\n",pcVar6);
      fflush(_stderr);
      width = 7;
    }
    else {
      if ((long)iVar2 < 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x55,"ttyin_fd",">=","0",(long)iVar2,">=",0);
        abort();
      }
      if ((long)file < 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x56,"ttyout_fd",">=","0",(long)file,">=",0);
        abort();
      }
      uVar3 = uv_guess_handle(-1);
      if ((ulong)uVar3 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x59,"UV_UNKNOWN_HANDLE","==","uv_guess_handle((uv_os_fd_t) -1)",0,"==",
                (ulong)uVar3);
        abort();
      }
      uVar3 = uv_guess_handle(iVar2);
      if ((ulong)uVar3 != 0xe) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x5b,"UV_TTY","==","uv_guess_handle(ttyin_fd)",0xe,"==",(ulong)uVar3);
        abort();
      }
      uVar3 = uv_guess_handle(file);
      if ((ulong)uVar3 != 0xe) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x5c,"UV_TTY","==","uv_guess_handle(ttyout_fd)",0xe,"==",(ulong)uVar3);
        abort();
      }
      height = uv_tty_init(puVar4,(uv_tty_t *)&tty_out.orig_termios.c_ospeed,iVar2,1);
      if ((long)height != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x5f,"r","==","0",(long)height,"==",0);
        abort();
      }
      iVar2 = uv_is_readable((uv_stream_t *)&tty_out.orig_termios.c_ospeed);
      if (iVar2 == 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x60,"uv_is_readable((uv_stream_t*) &tty_in)");
        abort();
      }
      iVar2 = uv_is_writable((uv_stream_t *)&tty_out.orig_termios.c_ospeed);
      if (iVar2 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x61,"!uv_is_writable((uv_stream_t*) &tty_in)");
        abort();
      }
      height = uv_tty_init(puVar4,(uv_tty_t *)&loop,file,0);
      if ((long)height != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,100,"r","==","0",(long)height,"==",0);
        abort();
      }
      iVar2 = uv_is_readable((uv_stream_t *)&loop);
      if (iVar2 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x65,"!uv_is_readable((uv_stream_t*) &tty_out)");
        abort();
      }
      iVar2 = uv_is_writable((uv_stream_t *)&loop);
      if (iVar2 == 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x66,"uv_is_writable((uv_stream_t*) &tty_out)");
        abort();
      }
      height = uv_tty_get_winsize((uv_tty_t *)&loop,&ttyin_fd,&ttyout_fd);
      if ((long)height != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                ,0x69,"r","==","0",(long)height,"==",0);
        abort();
      }
      printf("width=%d height=%d\n",(ulong)(uint)ttyin_fd,(ulong)(uint)ttyout_fd);
      if ((ttyin_fd == 0) && (ttyout_fd == 0)) {
        close_loop(puVar4);
        iVar2 = uv_loop_close(puVar4);
        if ((long)iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x70,"0","==","uv_loop_close(loop)",0,"==",(long)iVar2);
          abort();
        }
        uv_library_shutdown();
        width = 7;
      }
      else {
        if ((long)ttyin_fd < 1) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x74,"width",">","0",(long)ttyin_fd,">",0);
          abort();
        }
        if ((long)ttyout_fd < 1) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x75,"height",">","0",(long)ttyout_fd,">",0);
          abort();
        }
        height = uv_tty_set_mode((uv_tty_t *)&tty_out.orig_termios.c_ospeed,UV_TTY_MODE_RAW);
        if ((long)height != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x79,"r","==","0",(long)height,"==",0);
          abort();
        }
        height = uv_tty_set_mode((uv_tty_t *)&tty_out.orig_termios.c_ospeed,UV_TTY_MODE_NORMAL);
        if ((long)height != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x7d,"r","==","0",(long)height,"==",0);
          abort();
        }
        piVar5 = __errno_location();
        *piVar5 = 0;
        iVar2 = uv_tty_reset_mode();
        if ((long)iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x81,"uv_tty_reset_mode()","==","0",(long)iVar2,"==",0);
          abort();
        }
        iVar2 = uv_tty_reset_mode();
        if ((long)iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x82,"uv_tty_reset_mode()","==","0",(long)iVar2,"==",0);
          abort();
        }
        iVar2 = uv_tty_reset_mode();
        if ((long)iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x83,"uv_tty_reset_mode()","==","0",(long)iVar2,"==",0);
          abort();
        }
        piVar5 = __errno_location();
        if ((long)*piVar5 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x84,"(*__errno_location ())","==","0",(long)*piVar5,"==",0);
          abort();
        }
        uv_close((uv_handle_t *)&tty_out.orig_termios.c_ospeed,(uv_close_cb)0x0);
        uv_close((uv_handle_t *)&loop,(uv_close_cb)0x0);
        uv_run(puVar4,UV_RUN_DEFAULT);
        puVar4 = uv_default_loop();
        close_loop(puVar4);
        puVar4 = uv_default_loop();
        iVar2 = uv_loop_close(puVar4);
        if ((long)iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,0x8d,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar2);
          abort();
        }
        uv_library_shutdown();
        width = 0;
      }
    }
  }
  return width;
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  uv_os_fd_t ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  ttyin_fd = CreateFileA("conin$",
                         GENERIC_READ | GENERIC_WRITE,
                         FILE_SHARE_READ | FILE_SHARE_WRITE,
                         NULL,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         NULL);
  ASSERT_PTR_NE(ttyin_fd, INVALID_HANDLE_VALUE);

  ttyout_fd = CreateFileA("conout$",
                          GENERIC_READ | GENERIC_WRITE,
                          FILE_SHARE_READ | FILE_SHARE_WRITE,
                          NULL,
                          OPEN_EXISTING,
                          FILE_ATTRIBUTE_NORMAL,
                          NULL);
  ASSERT_PTR_NE(ttyout_fd, INVALID_HANDLE_VALUE);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ASSERT_GE(ttyin_fd, 0);
  ASSERT_GE(ttyout_fd, 0);
#endif

  ASSERT_EQ(UV_UNKNOWN_HANDLE, uv_guess_handle((uv_os_fd_t) -1));

  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyin_fd));
  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyout_fd));

  r = uv_tty_init(loop, &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT_OK(r);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(loop, &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT_OK(r);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT_OK(r);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY(loop);
    return TEST_SKIP;
  }

  ASSERT_GT(width, 0);
  ASSERT_GT(height, 0);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT_OK(r);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT_OK(r);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}